

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O2

string * __thiscall
loader::to_string_abi_cxx11_(string *__return_storage_ptr__,loader *this,ze_init_flags_t flags)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (((ulong)this & 1) == 0) {
    if (((ulong)this & 2) == 0) {
      if ((int)this != 0) {
        std::__cxx11::to_string(__return_storage_ptr__,(int)this);
        return __return_storage_ptr__;
      }
      pcVar2 = "0(ZE_INIT_ALL_DRIVER_TYPES_ENABLED)";
      paVar1 = &local_b;
    }
    else {
      pcVar2 = "ZE_INIT_FLAG_VPU_ONLY";
      paVar1 = &local_a;
    }
  }
  else {
    pcVar2 = "ZE_INIT_FLAG_GPU_ONLY";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_init_flags_t flags) {
        if (flags & ZE_INIT_FLAG_GPU_ONLY) {
            return "ZE_INIT_FLAG_GPU_ONLY";
        } else if (flags & ZE_INIT_FLAG_VPU_ONLY) {
            return "ZE_INIT_FLAG_VPU_ONLY";
        } else if (flags == 0) {
            return "0(ZE_INIT_ALL_DRIVER_TYPES_ENABLED)";
        } else {
            return (std::to_string(static_cast<int>(flags)));
        }
    }